

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::BuildMacContentDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *base,string *config,
          bool contentOnly)

{
  bool bVar1;
  string local_40;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)base);
  bVar1 = IsAppBundleOnApple(this);
  if (bVar1) {
    GetAppBundleDirectory(&local_40,this,config,contentOnly);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_40);
  }
  bVar1 = IsFrameworkOnApple(this);
  if (bVar1) {
    GetFrameworkDirectory(&local_40,this,config,contentOnly);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_40);
  }
  bVar1 = IsCFBundleOnApple(this);
  if (bVar1) {
    GetCFBundleDirectory(&local_40,this,config,contentOnly);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmGeneratorTarget::BuildMacContentDirectory(const std::string& base,
                                            const std::string& config,
                                            bool contentOnly) const
{
  std::string fpath = base;
  if(this->IsAppBundleOnApple())
    {
    fpath += this->GetAppBundleDirectory(config, contentOnly);
    }
  if(this->IsFrameworkOnApple())
    {
    fpath += this->GetFrameworkDirectory(config, contentOnly);
    }
  if(this->IsCFBundleOnApple())
    {
    fpath += this->GetCFBundleDirectory(config, contentOnly);
    }
  return fpath;
}